

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

_Bool hostcompare(char *host,char *check)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t max;
  _Bool _Var4;
  
  sVar2 = strlen(host);
  sVar3 = strlen(check);
  if (sVar2 == 0) {
    max = 0;
  }
  else {
    max = sVar2 - (host[sVar2 - 1] == '.');
  }
  if (max == sVar3) {
    iVar1 = curl_strnequal(host,check,max);
    _Var4 = iVar1 != 0;
  }
  else {
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

static bool hostcompare(const char *host, const char *check)
{
  size_t hlen = strlen(host);
  size_t clen = strlen(check);

  if(hlen && (host[hlen - 1] == '.'))
    hlen--;
  if(hlen != clen)
    /* they cannot match if they have different lengths */
    return FALSE;
  return strncasecompare(host, check, hlen);
}